

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O0

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:329:35)>
          *this,Type a,Type b)

{
  bool bVar1;
  bool bVar2;
  BasicType BVar3;
  BasicType BVar4;
  Tuple *a_00;
  Tuple *b_00;
  HeapType a_01;
  HeapType b_01;
  bool local_69;
  RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:329:35)>
  *this_local;
  Type b_local;
  Type a_local;
  
  this_local = (RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:329:35)>
                *)b.id;
  b_local = a;
  bVar1 = wasm::Type::isBasic(&b_local);
  bVar2 = wasm::Type::isBasic((Type *)&this_local);
  if (bVar1 == bVar2) {
    bVar1 = wasm::Type::isBasic(&b_local);
    if (bVar1) {
      BVar3 = wasm::Type::getBasic(&b_local);
      BVar4 = wasm::Type::getBasic((Type *)&this_local);
      if (BVar3 == BVar4) {
        a_local.id._4_4_ = EQ;
      }
      else {
        BVar3 = wasm::Type::getBasic(&b_local);
        BVar4 = wasm::Type::getBasic((Type *)&this_local);
        a_local.id._4_4_ = GT;
        if (BVar3 < BVar4) {
          a_local.id._4_4_ = LT;
        }
      }
    }
    else {
      bVar1 = wasm::Type::isTuple(&b_local);
      bVar2 = wasm::Type::isTuple((Type *)&this_local);
      if (bVar1 == bVar2) {
        bVar1 = wasm::Type::isTuple(&b_local);
        if (bVar1) {
          a_00 = wasm::Type::getTuple(&b_local);
          b_00 = wasm::Type::getTuple((Type *)&this_local);
          a_local.id._4_4_ = compare(this,a_00,b_00);
        }
        else {
          bVar1 = wasm::Type::isRef(&b_local);
          local_69 = false;
          if (bVar1) {
            local_69 = wasm::Type::isRef((Type *)&this_local);
          }
          if (local_69 == false) {
            __assert_fail("a.isRef() && b.isRef()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp"
                          ,0x95,
                          "Comparison wasm::(anonymous namespace)::RecGroupComparator<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)>::compare(Type, Type) [CompareTypes = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)]"
                         );
          }
          bVar1 = wasm::Type::isNullable(&b_local);
          bVar2 = wasm::Type::isNullable((Type *)&this_local);
          if (bVar1 == bVar2) {
            a_01 = wasm::Type::getHeapType(&b_local);
            b_01 = wasm::Type::getHeapType((Type *)&this_local);
            a_local.id._4_4_ = compare(this,a_01,b_01);
          }
          else {
            bVar1 = wasm::Type::isNullable(&b_local);
            bVar2 = wasm::Type::isNullable((Type *)&this_local);
            a_local.id._4_4_ = GT;
            if (bVar1 < bVar2) {
              a_local.id._4_4_ = LT;
            }
          }
        }
      }
      else {
        bVar1 = wasm::Type::isTuple(&b_local);
        bVar2 = wasm::Type::isTuple((Type *)&this_local);
        a_local.id._4_4_ = GT;
        if (bVar1 < bVar2) {
          a_local.id._4_4_ = LT;
        }
      }
    }
  }
  else {
    bVar1 = wasm::Type::isBasic((Type *)&this_local);
    bVar2 = wasm::Type::isBasic(&b_local);
    a_local.id._4_4_ = GT;
    if (bVar1 < bVar2) {
      a_local.id._4_4_ = LT;
    }
  }
  return a_local.id._4_4_;
}

Assistant:

Comparison compare(Type a, Type b) {
    if (a.isBasic() != b.isBasic()) {
      return b.isBasic() < a.isBasic() ? LT : GT;
    }
    if (a.isBasic()) {
      if (a.getBasic() != b.getBasic()) {
        return a.getBasic() < b.getBasic() ? LT : GT;
      }
      return EQ;
    }
    if (a.isTuple() != b.isTuple()) {
      return a.isTuple() < b.isTuple() ? LT : GT;
    }
    if (a.isTuple()) {
      return compare(a.getTuple(), b.getTuple());
    }
    assert(a.isRef() && b.isRef());
    if (a.isNullable() != b.isNullable()) {
      return a.isNullable() < b.isNullable() ? LT : GT;
    }
    return compare(a.getHeapType(), b.getHeapType());
  }